

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

void gl4cts::BufferStorage::Texture::Storage
               (Functions *gl,GLenum target,GLsizei levels,GLenum internal_format,GLuint width,
               GLuint height,GLuint depth)

{
  GLenum err;
  TestError *this;
  int line;
  char *msg;
  
  if ((int)target < 0x84f5) {
    if (target == 0xde0) {
      (*gl->texStorage1D)(0xde0,levels,internal_format,width);
      err = (*gl->getError)();
      msg = "TexStorage1D";
      line = 0x5dd;
      goto LAB_0087dbdb;
    }
    if (target != 0xde1) {
      if (target != 0x806f) goto LAB_0087db2b;
      goto LAB_0087db7c;
    }
  }
  else if ((int)target < 0x8c18) {
    if ((target != 0x84f5) && (target != 0x8513)) {
LAB_0087db2b:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                 ,0x5ec);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else if (target != 0x8c18) {
    if (target != 0x8c1a) goto LAB_0087db2b;
LAB_0087db7c:
    (*gl->texStorage3D)(target,levels,internal_format,width,height,depth);
    err = (*gl->getError)();
    msg = "TexStorage3D";
    line = 0x5e9;
    goto LAB_0087dbdb;
  }
  (*gl->texStorage2D)(target,levels,internal_format,width,height);
  err = (*gl->getError)();
  msg = "TexStorage2D";
  line = 0x5e4;
LAB_0087dbdb:
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,line);
  return;
}

Assistant:

void Texture::Storage(const glw::Functions& gl, glw::GLenum target, glw::GLsizei levels, glw::GLenum internal_format,
					  glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texStorage1D(target, levels, internal_format, width);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage1D");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
	case GL_TEXTURE_CUBE_MAP:
		gl.texStorage2D(target, levels, internal_format, width, height);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage2D");
		break;
	case GL_TEXTURE_3D:
	case GL_TEXTURE_2D_ARRAY:
		gl.texStorage3D(target, levels, internal_format, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexStorage3D");
		break;
	default:
		TCU_FAIL("Invliad enum");
		break;
	}
}